

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

Gia_Man_t * Gia_ManDupCollapse(Gia_Man_t *p,Gia_Man_t *pBoxes,Vec_Int_t *vBoxPres,int fSeq)

{
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  size_t sVar8;
  char *pcVar9;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  char *pcVar15;
  char cVar16;
  ulong uVar17;
  Gia_Obj_t *pGVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  int local_74;
  uint local_64;
  int local_5c;
  int local_58;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  if ((fSeq != 0) && (p->vRegClasses == (Vec_Int_t *)0x0)) {
    __assert_fail("!fSeq || p->vRegClasses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x329,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  iVar3 = p->vCis->nSize;
  iVar2 = Tim_ManPiNum(p_00);
  if (iVar3 != iVar2 + pBoxes->vCos->nSize) {
    __assert_fail("Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x32b,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  pGVar7 = Gia_ManStart(p->nObjs);
  pcVar15 = p->pName;
  if (pcVar15 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar15);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar15);
  }
  pGVar7->pName = pcVar9;
  pcVar15 = p->pSpec;
  if (pcVar15 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar15);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar15);
  }
  pGVar7->pSpec = pcVar9;
  if (p->pSibls != (int *)0x0) {
    piVar10 = (int *)calloc((long)p->nObjs,4);
    pGVar7->pSibls = piVar10;
  }
  Gia_ManHashAlloc(pGVar7);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_00236aec:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_00236b0b:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  iVar3 = Tim_ManPiNum(p_00);
  if (0 < iVar3) {
    lVar19 = 0;
    do {
      if (p->vCis->nSize <= lVar19) goto LAB_00236acd;
      iVar3 = p->vCis->pArray[lVar19];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00236aae;
      pGVar13 = p->pObjs + iVar3;
      pGVar11 = Gia_ManAppendObj(pGVar7);
      uVar21 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar21 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar21 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar7->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar18 = pGVar7->pObjs;
      if ((pGVar11 < pGVar18) || (pGVar18 + pGVar7->nObjs <= pGVar11)) goto LAB_00236aec;
      Vec_IntPush(pGVar7->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar18) >> 2) * -0x55555555);
      pGVar18 = pGVar7->pObjs;
      if ((pGVar11 < pGVar18) || (pGVar18 + pGVar7->nObjs <= pGVar11)) goto LAB_00236aec;
      pGVar13->Value = (int)((ulong)((long)pGVar11 - (long)pGVar18) >> 2) * 0x55555556;
      pGVar18 = p->pObjs;
      if ((pGVar13 < pGVar18) || (pGVar18 + p->nObjs <= pGVar13)) goto LAB_00236aec;
      iVar3 = (int)((long)pGVar13 - (long)pGVar18 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar3) goto LAB_00236b0b;
      p->pTravIds[iVar3] = p->nTravIds;
      lVar19 = lVar19 + 1;
      iVar3 = Tim_ManPiNum(p_00);
    } while (lVar19 < iVar3);
  }
  local_64 = Tim_ManPiNum(p_00);
  iVar3 = Tim_ManBoxNum(p_00);
  if (iVar3 < 1) {
    local_74 = 0;
    local_5c = 0;
    local_58 = 0;
    iVar3 = 0;
  }
  else {
    lVar19 = 0;
    iVar3 = 0;
    local_58 = 0;
    local_5c = 0;
    local_74 = 0;
    do {
      Gia_ManIncrementTravId(pBoxes);
      if (pBoxes->nObjs < 1) goto LAB_00236aec;
      if (pBoxes->nTravIdsAlloc < 1) goto LAB_00236b0b;
      pGVar18 = pBoxes->pObjs;
      *pBoxes->pTravIds = pBoxes->nTravIds;
      pGVar18->Value = 0;
      iVar5 = (int)lVar19;
      iVar2 = Tim_ManBoxIsBlack(p_00,iVar5);
      if (iVar2 == 0) {
        iVar2 = Tim_ManBoxInputNum(p_00,iVar5);
        if (0 < iVar2) {
          lVar20 = (long)local_74;
          lVar22 = 0;
          do {
            if ((local_74 < 0) || (p->vCos->nSize <= lVar20)) goto LAB_00236acd;
            iVar2 = p->vCos->pArray[lVar20];
            if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00236aae;
            pGVar18 = p->pObjs + iVar2;
            Gia_ManDupCollapse_rec
                      (p,pGVar18 + -(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff),pGVar7);
            if (pBoxes->vCis->nSize <= lVar22) goto LAB_00236acd;
            iVar2 = pBoxes->vCis->pArray[lVar22];
            lVar12 = (long)iVar2;
            if ((lVar12 < 0) || (pBoxes->nObjs <= iVar2)) goto LAB_00236aae;
            if ((int)pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value < 0)
            goto LAB_00236b2a;
            pBoxes->pObjs[lVar12].Value =
                 (uint)*(undefined8 *)pGVar18 >> 0x1d & 1 ^
                 pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value;
            if (pBoxes->nTravIdsAlloc <= iVar2) goto LAB_00236b0b;
            pBoxes->pTravIds[lVar12] = pBoxes->nTravIds;
            lVar22 = lVar22 + 1;
            iVar2 = Tim_ManBoxInputNum(p_00,iVar5);
            lVar20 = lVar20 + 1;
          } while (lVar22 < iVar2);
        }
        iVar2 = Tim_ManBoxOutputNum(p_00,iVar5);
        if (0 < iVar2) {
          lVar22 = (long)(int)local_64;
          lVar20 = 0;
          do {
            iVar2 = Tim_ManPiNum(p_00);
            uVar21 = (ulong)(uint)-iVar2 + (ulong)local_64 + lVar20;
            iVar2 = (int)uVar21;
            if ((iVar2 < 0) || (pBoxes->vCos->nSize <= iVar2)) goto LAB_00236acd;
            iVar2 = pBoxes->vCos->pArray[uVar21 & 0xffffffff];
            if (((long)iVar2 < 0) || (pBoxes->nObjs <= iVar2)) goto LAB_00236aae;
            pGVar18 = pBoxes->pObjs + iVar2;
            Gia_ManDupCollapse_rec
                      (pBoxes,pGVar18 + -(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff),pGVar7);
            if ((lVar22 < 0) || (p->vCis->nSize <= lVar22)) goto LAB_00236acd;
            iVar2 = p->vCis->pArray[lVar22];
            lVar12 = (long)iVar2;
            if ((lVar12 < 0) || (p->nObjs <= iVar2)) goto LAB_00236aae;
            if ((int)pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value < 0)
            goto LAB_00236b2a;
            p->pObjs[lVar12].Value =
                 (uint)*(undefined8 *)pGVar18 >> 0x1d & 1 ^
                 pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value;
            if (p->nTravIdsAlloc <= iVar2) goto LAB_00236b0b;
            p->pTravIds[lVar12] = p->nTravIds;
            lVar20 = lVar20 + 1;
            iVar2 = Tim_ManBoxOutputNum(p_00,iVar5);
            lVar22 = lVar22 + 1;
          } while (lVar20 < iVar2);
        }
      }
      else {
        if (vBoxPres == (Vec_Int_t *)0x0) {
          bVar23 = false;
        }
        else {
          if (vBoxPres->nSize <= lVar19) goto LAB_00236acd;
          bVar23 = vBoxPres->pArray[lVar19] == 0;
        }
        iVar2 = Tim_ManBoxInputNum(p_00,iVar5);
        if (0 < iVar2) {
          lVar20 = (long)local_74;
          lVar22 = 0;
          do {
            if ((local_74 < 0) || (p->vCos->nSize <= lVar20)) goto LAB_00236acd;
            iVar2 = p->vCos->pArray[lVar20];
            if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00236aae;
            pGVar18 = p->pObjs + iVar2;
            Gia_ManDupCollapse_rec
                      (p,pGVar18 + -(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff),pGVar7);
            uVar4 = 0xffffffff;
            if (bVar23 == false) {
              if ((int)pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value < 0)
              goto LAB_00236b2a;
              uVar4 = Gia_ManAppendCo(pGVar7,(uint)*(undefined8 *)pGVar18 >> 0x1d & 1 ^
                                             pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 &
                                                             0x1fffffff)].Value);
            }
            pGVar18->Value = uVar4;
            lVar22 = lVar22 + 1;
            iVar2 = Tim_ManBoxInputNum(p_00,iVar5);
            lVar20 = lVar20 + 1;
          } while (lVar22 < iVar2);
          local_58 = local_58 + (int)lVar22;
        }
        iVar2 = Tim_ManBoxOutputNum(p_00,iVar5);
        if (0 < iVar2) {
          lVar20 = (long)(int)local_64;
          lVar22 = 0;
          do {
            if (((int)local_64 < 0) || (p->vCis->nSize <= lVar20)) goto LAB_00236acd;
            iVar2 = p->vCis->pArray[lVar20];
            if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00236aae;
            pGVar18 = p->pObjs + iVar2;
            uVar4 = 0;
            if (bVar23 == false) {
              pGVar13 = Gia_ManAppendObj(pGVar7);
              uVar21 = *(ulong *)pGVar13;
              *(ulong *)pGVar13 = uVar21 | 0x9fffffff;
              *(ulong *)pGVar13 =
                   uVar21 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar7->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar11 = pGVar7->pObjs;
              if ((pGVar13 < pGVar11) || (pGVar11 + pGVar7->nObjs <= pGVar13)) goto LAB_00236aec;
              Vec_IntPush(pGVar7->vCis,
                          (int)((ulong)((long)pGVar13 - (long)pGVar11) >> 2) * -0x55555555);
              pGVar11 = pGVar7->pObjs;
              if ((pGVar13 < pGVar11) || (pGVar11 + pGVar7->nObjs <= pGVar13)) goto LAB_00236aec;
              uVar4 = (int)((ulong)((long)pGVar13 - (long)pGVar11) >> 2) * 0x55555556;
            }
            pGVar18->Value = uVar4;
            pGVar11 = p->pObjs;
            if ((pGVar18 < pGVar11) || (pGVar11 + p->nObjs <= pGVar18)) goto LAB_00236aec;
            iVar2 = (int)((long)pGVar18 - (long)pGVar11 >> 2) * -0x55555555;
            if (p->nTravIdsAlloc <= iVar2) goto LAB_00236b0b;
            p->pTravIds[iVar2] = p->nTravIds;
            iVar3 = iVar3 + (uint)(bVar23 ^ 1);
            lVar22 = lVar22 + 1;
            iVar2 = Tim_ManBoxOutputNum(p_00,iVar5);
            lVar20 = lVar20 + 1;
          } while (lVar22 < iVar2);
          local_5c = local_5c + (int)lVar22;
        }
      }
      iVar2 = Tim_ManBoxInputNum(p_00,iVar5);
      local_74 = local_74 + iVar2;
      iVar2 = Tim_ManBoxOutputNum(p_00,iVar5);
      local_64 = local_64 + iVar2;
      lVar19 = lVar19 + 1;
      iVar2 = Tim_ManBoxNum(p_00);
    } while (lVar19 < iVar2);
  }
  iVar2 = Tim_ManCoNum(p_00);
  iVar5 = Tim_ManPoNum(p_00);
  uVar4 = iVar2 - iVar5;
  iVar2 = Tim_ManCoNum(p_00);
  if ((int)uVar4 < iVar2) {
    uVar21 = (ulong)uVar4;
    do {
      if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar21)) goto LAB_00236acd;
      iVar2 = p->vCos->pArray[uVar21];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00236aae;
      pGVar18 = p->pObjs + iVar2;
      Gia_ManDupCollapse_rec(p,pGVar18 + -(*(ulong *)pGVar18 & 0x1fffffff),pGVar7);
      if ((int)pGVar18[-(*(ulong *)pGVar18 & 0x1fffffff)].Value < 0) {
LAB_00236b2a:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(pGVar7,(uint)(*(ulong *)pGVar18 >> 0x1d) & 1 ^
                                     pGVar18[-(*(ulong *)pGVar18 & 0x1fffffff)].Value);
      pGVar18->Value = uVar6;
      uVar21 = uVar21 + 1;
      iVar2 = Tim_ManCoNum(p_00);
    } while ((int)uVar21 < iVar2);
  }
  iVar2 = Tim_ManPoNum(p_00);
  if (local_64 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x37f,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  if (iVar2 + local_74 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x380,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  if ((fSeq == 0) || (p->vRegClasses == (Vec_Int_t *)0x0)) {
    piVar10 = &p->nRegs;
  }
  else {
    piVar10 = &p->vRegClasses->nSize;
  }
  Gia_ManSetRegNum(pGVar7,*piVar10);
  Gia_ManHashStop(pGVar7);
  pGVar14 = Gia_ManCleanup(pGVar7);
  Gia_ManCleanupRemap(p,pGVar7);
  Gia_ManStop(pGVar7);
  pGVar7 = pGVar14;
  if (iVar3 != 0) {
    iVar2 = Tim_ManPiNum(p_00);
    pGVar7 = Gia_ManDupMoveLast(pGVar14,iVar2 - pGVar14->nRegs,iVar3);
    Gia_ManCleanupRemap(p,pGVar14);
    Gia_ManStop(pGVar14);
  }
  if (vBoxPres == (Vec_Int_t *)0x0) {
    iVar3 = Tim_ManPoNum(p_00);
    if (iVar3 != pGVar7->vCos->nSize - local_58) {
      __assert_fail("vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x395,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
    iVar3 = Tim_ManPiNum(p_00);
    if (iVar3 != pGVar7->vCis->nSize - local_5c) {
      __assert_fail("vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x396,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
  }
  if ((fSeq != 0) && (pVVar1 = p->vRegInits, pVVar1 != (Vec_Int_t *)0x0)) {
    uVar4 = pVVar1->nSize;
    if (0 < (int)uVar4) {
      uVar21 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + pVVar1->pArray[uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar4 != uVar21);
      if (iVar3 != 0) {
        pcVar15 = (char *)malloc((ulong)uVar4 + 1);
        if (uVar4 != pGVar7->nRegs) {
          __assert_fail("Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                        ,0x39d,
                        "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)")
          ;
        }
        uVar17 = (ulong)(uint)pGVar7->nRegs;
        uVar21 = 0;
        if (0 < pGVar7->nRegs) {
          do {
            iVar3 = pGVar7->vCis->nSize;
            uVar17 = (uint)(iVar3 - (int)uVar17) + uVar21;
            iVar2 = (int)uVar17;
            if ((iVar2 < 0) || (iVar3 <= iVar2)) {
LAB_00236acd:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = pGVar7->vCis->pArray[uVar17 & 0xffffffff];
            if ((iVar3 < 0) || (pGVar7->nObjs <= iVar3)) {
LAB_00236aae:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
            if ((long)pVVar1->nSize <= (long)uVar21) goto LAB_00236acd;
            cVar16 = 'X';
            if (pVVar1->pArray[uVar21] == 1) {
              cVar16 = '1';
            }
            if (pVVar1->pArray[uVar21] == 0) {
              cVar16 = '0';
            }
            pcVar15[uVar21] = cVar16;
            uVar21 = uVar21 + 1;
            uVar17 = (ulong)pGVar7->nRegs;
          } while ((long)uVar21 < (long)uVar17);
          uVar21 = uVar21 & 0xffffffff;
        }
        pcVar15[uVar21] = '\0';
        pGVar14 = Gia_ManDupZeroUndc(pGVar7,pcVar15,0,0,1);
        pGVar14->nConstrs = pGVar7->nConstrs;
        pGVar7->nConstrs = 0;
        Gia_ManStop(pGVar7);
        pGVar7 = pGVar14;
        if (pcVar15 != (char *)0x0) {
          free(pcVar15);
        }
      }
    }
  }
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManDupCollapse( Gia_Man_t * p, Gia_Man_t * pBoxes, Vec_Int_t * vBoxPres, int fSeq )
{
    // this procedure assumes that sequential AIG with boxes is unshuffled to have valid boxes
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjBox;
    int i, k, curCi, curCo, nBBins = 0, nBBouts = 0, nNewPis = 0;
    assert( !fSeq || p->vRegClasses );
    //assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManHashAlloc( pNew );
    // copy const and real PIs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        pObj->Value = Gia_ManAppendCi(pNew);
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        // clean boxes
        Gia_ManIncrementTravId( pBoxes );
        Gia_ObjSetTravIdCurrent( pBoxes, Gia_ManConst0(pBoxes) );
        Gia_ManConst0(pBoxes)->Value = 0;
        // add internal nodes
        //printf( "%d ", Tim_ManBoxIsBlack(pManTime, i) );
        if ( Tim_ManBoxIsBlack(pManTime, i) )
        {
            int fSkip = (vBoxPres != NULL && !Vec_IntEntry(vBoxPres, i));
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                pObj->Value = fSkip ? -1 : Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                nBBouts++;
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = fSkip ? 0 : Gia_ManAppendCi(pNew);
                Gia_ObjSetTravIdCurrent( p, pObj );
                nBBins++;
                nNewPis += !fSkip;
            }
        }
        else
        {
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                // build logic
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                // transfer to the PI
                pObjBox = Gia_ManCi( pBoxes, k );
                pObjBox->Value = Gia_ObjFanin0Copy(pObj);
                Gia_ObjSetTravIdCurrent( pBoxes, pObjBox );
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                // build logic
                pObjBox = Gia_ManCo( pBoxes, curCi - Tim_ManPiNum(pManTime) + k );
                Gia_ManDupCollapse_rec( pBoxes, Gia_ObjFanin0(pObjBox), pNew );
                // transfer to the PI
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = Gia_ObjFanin0Copy(pObjBox);
                Gia_ObjSetTravIdCurrent( p, pObj );
            }
        }
        curCo += Tim_ManBoxInputNum(pManTime, i);
        curCi += Tim_ManBoxOutputNum(pManTime, i);
    }
    //printf( "\n" );
    // add remaining nodes
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    Gia_ManSetRegNum( pNew, (fSeq && p->vRegClasses) ? Vec_IntSize(p->vRegClasses) : Gia_ManRegNum(p) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManCleanupRemap( p, pTemp );
    Gia_ManStop( pTemp );
    if ( nNewPis )
    {
        pNew = Gia_ManDupMoveLast( pTemp = pNew, Tim_ManPiNum(pManTime)-Gia_ManRegNum(pNew), nNewPis );
        Gia_ManCleanupRemap( p, pTemp );
        Gia_ManStop( pTemp );
    }
/*
    printf( "%d = %d - %d    Diff = %d\n", 
        Tim_ManPoNum(pManTime),   Gia_ManCoNum(pNew),  nBBouts, 
        Tim_ManPoNum(pManTime) - (Gia_ManCoNum(pNew) - nBBouts) );

    printf( "%d = %d - %d    Diff = %d\n\n", 
        Tim_ManPiNum(pManTime),   Gia_ManCiNum(pNew),  nBBins, 
        Tim_ManPiNum(pManTime) - (Gia_ManCiNum(pNew) - nBBins) );
*/
    assert( vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts );
    assert( vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins );
    // implement initial state if given
    if ( fSeq && p->vRegInits && Vec_IntSum(p->vRegInits) )
    {
        char * pInit = ABC_ALLOC( char, Vec_IntSize(p->vRegInits) + 1 );
        Gia_Obj_t * pObj;
        int i;
        assert( Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew) );
        Gia_ManForEachRo( pNew, pObj, i )
        {
            if ( Vec_IntEntry(p->vRegInits, i) == 0 )
                pInit[i] = '0';
            else if ( Vec_IntEntry(p->vRegInits, i) == 1 )
                pInit[i] = '1';
            else 
                pInit[i] = 'X';
        }
        pInit[i] = 0;
        pNew = Gia_ManDupZeroUndc( pTemp = pNew, pInit, 0, 0, 1 );
        pNew->nConstrs = pTemp->nConstrs; pTemp->nConstrs = 0;
        Gia_ManStop( pTemp );
        ABC_FREE( pInit );
    }
    return pNew;
}